

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::DescriptorProto_ExtensionRange::_InternalParse
          (DescriptorProto_ExtensionRange *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  bool bVar2;
  ExtensionRangeOptions *pEVar3;
  uint uVar4;
  uint32 uVar5;
  UnknownFieldSet *unknown;
  byte *p;
  Arena *arena;
  uint uVar6;
  char cVar7;
  uint res;
  pair<const_char_*,_unsigned_int> pVar8;
  pair<const_char_*,_unsigned_long> pVar9;
  pair<const_char_*,_unsigned_long> pVar10;
  byte *local_38;
  char *ptr_local;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  uVar6 = 0;
  local_38 = (byte *)ptr;
  do {
    bVar2 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar2) goto LAB_00299541;
    bVar1 = *local_38;
    res = (uint)bVar1;
    p = local_38 + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
      if ((char)*p < '\0') {
        pVar8 = internal::ReadTagFallback((char *)local_38,res);
        p = (byte *)pVar8.first;
        res = pVar8.second;
      }
      else {
        p = local_38 + 2;
      }
    }
    local_38 = p;
    if (p == (byte *)0x0) {
      cVar7 = '\x04';
    }
    else {
      uVar4 = res >> 3;
      cVar7 = (char)res;
      if (uVar4 == 3) {
        if (cVar7 != '\x1a') goto LAB_0029946b;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        if (this->options_ == (ExtensionRangeOptions *)0x0) {
          arena = (Arena *)this_00->ptr_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
          }
          pEVar3 = Arena::CreateMaybeMessage<google::protobuf::ExtensionRangeOptions>(arena);
          this->options_ = pEVar3;
        }
        local_38 = (byte *)internal::ParseContext::
                           ParseMessage<google::protobuf::ExtensionRangeOptions>
                                     (ctx,this->options_,(char *)local_38);
LAB_002994b3:
        cVar7 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
      }
      else {
        if (uVar4 == 2) {
          if (cVar7 != '\x10') goto LAB_0029946b;
          bVar1 = *p;
          pVar9.second = (long)(char)bVar1;
          pVar9.first = (char *)p;
          local_38 = p + 1;
          if ((long)(char)bVar1 < 0) {
            uVar5 = ((uint)*local_38 * 0x80 + (uint)bVar1) - 0x80;
            if ((char)*local_38 < '\0') {
              local_38 = p;
              pVar9 = internal::VarintParseSlow64((char *)p,uVar5);
            }
            else {
              pVar9.second._0_4_ = uVar5;
              pVar9.first = (char *)(p + 2);
              pVar9.second._4_4_ = 0;
            }
            local_38 = (byte *)pVar9.first;
          }
          uVar6 = uVar6 | 4;
          this->end_ = (int32)pVar9.second;
        }
        else {
          if ((uVar4 != 1) || (cVar7 != '\b')) {
LAB_0029946b:
            if (res == 0 || (res & 7) == 4) {
              (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
              cVar7 = '\a';
              goto LAB_00299505;
            }
            if (((ulong)this_00->ptr_ & 1) == 0) {
              unknown = internal::InternalMetadata::
                        mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
            }
            else {
              unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
            }
            local_38 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_38,ctx);
            goto LAB_002994b3;
          }
          bVar1 = *p;
          pVar10.second = (long)(char)bVar1;
          pVar10.first = (char *)p;
          local_38 = p + 1;
          if ((long)(char)bVar1 < 0) {
            uVar5 = ((uint)*local_38 * 0x80 + (uint)bVar1) - 0x80;
            if ((char)*local_38 < '\0') {
              local_38 = p;
              pVar10 = internal::VarintParseSlow64((char *)p,uVar5);
            }
            else {
              pVar10.second._0_4_ = uVar5;
              pVar10.first = (char *)(p + 2);
              pVar10.second._4_4_ = 0;
            }
            local_38 = (byte *)pVar10.first;
          }
          uVar6 = uVar6 | 2;
          this->start_ = (int32)pVar10.second;
        }
        cVar7 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
      }
    }
LAB_00299505:
  } while (cVar7 == '\x02');
  if (cVar7 == '\x04') {
    local_38 = (byte *)0x0;
  }
LAB_00299541:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar6;
  return (char *)local_38;
}

Assistant:

const char* DescriptorProto_ExtensionRange::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional int32 start = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_start(&has_bits);
          start_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 end = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.ExtensionRangeOptions options = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}